

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllZeros(IEEEFloat *this)

{
  uint uVar1;
  uint uVar2;
  integerPart *piVar3;
  integerPart HighBitMask;
  uint local_28;
  uint NumHighBits;
  uint i;
  uint PartCount;
  integerPart *Parts;
  IEEEFloat *this_local;
  
  piVar3 = significandParts(this);
  uVar1 = partCount(this);
  local_28 = 0;
  while( true ) {
    if (uVar1 - 1 <= local_28) {
      uVar2 = (uVar1 * 0x40 - this->semantics->precision) + 1;
      if (uVar2 < 0x41) {
        return (piVar3[uVar1 - 1] & 0xffffffffffffffffU >> ((byte)uVar2 & 0x3f)) == 0;
      }
      __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"clear than integerPartWidth\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x32a,"bool llvm::detail::IEEEFloat::isSignificandAllZeros() const");
    }
    if (piVar3[local_28] != 0) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool IEEEFloat::isSignificandAllZeros() const {
  // Test if the significand excluding the integral bit is all zeros. This
  // allows us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();

  for (unsigned i = 0; i < PartCount - 1; i++)
    if (Parts[i])
      return false;

  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "clear than integerPartWidth");
  const integerPart HighBitMask = ~integerPart(0) >> NumHighBits;

  if (Parts[PartCount - 1] & HighBitMask)
    return false;

  return true;
}